

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex_json.cpp
# Opt level: O3

void __thiscall duckdb::ComplexJSON::ComplexJSON(ComplexJSON *this,string *str)

{
  pointer pcVar1;
  
  (this->str_value)._M_dataplus._M_p = (pointer)&(this->str_value).field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + str->_M_string_length);
  (this->obj_value)._M_h._M_buckets = &(this->obj_value)._M_h._M_single_bucket;
  (this->obj_value)._M_h._M_bucket_count = 1;
  (this->obj_value)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->obj_value)._M_h._M_element_count = 0;
  (this->obj_value)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->obj_value)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->obj_value)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->is_object = false;
  return;
}

Assistant:

ComplexJSON::ComplexJSON(const string &str) : str_value(str), is_object(false) {
}